

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vec4 __thiscall tcu::getTextureBorderColorFloat(tcu *this,TextureFormat *format,Sampler *sampler)

{
  float fVar1;
  Channel CVar2;
  int c;
  TextureChannelClass TVar3;
  TextureSwizzle *pTVar4;
  long lVar5;
  float fVar6;
  undefined1 in_XMM1 [16];
  float fVar7;
  Vec4 VVar8;
  
  TVar3 = getTextureChannelClass(format->type);
  pTVar4 = getBorderColorReadSwizzle(format->order);
  fVar6 = 0.0;
  if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar6 = -1.0;
  }
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    CVar2 = pTVar4->components[lVar5];
    if ((long)(int)CVar2 == 4) {
      in_XMM1 = ZEXT816(0);
    }
    else if (CVar2 == CHANNEL_ONE) {
      in_XMM1._0_12_ = ZEXT812(0x3f800000);
      in_XMM1._12_4_ = 0;
    }
    else {
      fVar1 = (sampler->borderColor).v.fData[(int)CVar2];
      in_XMM1 = ZEXT416((uint)fVar1);
      if (TVar3 != TEXTURECHANNELCLASS_FLOATING_POINT) {
        fVar7 = 1.0;
        if (fVar1 <= 1.0) {
          fVar7 = fVar1;
        }
        in_XMM1 = ZEXT416(-(uint)(fVar1 < fVar6) & (uint)fVar6 |
                          ~-(uint)(fVar1 < fVar6) & (uint)fVar7);
      }
    }
    *(int *)(this + lVar5 * 4) = in_XMM1._0_4_;
  }
  VVar8.m_data._8_8_ = in_XMM1._0_8_;
  VVar8.m_data[0] = 1.0;
  VVar8.m_data[1] = 0.0;
  return (Vec4)VVar8.m_data;
}

Assistant:

static tcu::Vec4 getTextureBorderColorFloat (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const bool						isFloat			= channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool						isSigned		= channelClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const float						valueMin		= (isSigned) ? (-1.0f) : (0.0f);
	const float						valueMax		= 1.0f;
	Vec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0.0f;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1.0f;
		else if (isFloat)
		{
			// floating point values are not clamped
			result[c] = sampler.borderColor.getAccess<float>()[(int)map];
		}
		else
		{
			// fixed point values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<float>()[(int)map], valueMin, valueMax);
		}
	}

	return result;
}